

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O0

char * tr_short_str(TestResult *tr)

{
  char *pcVar1;
  char *rstr;
  char *exact_msg;
  TestResult *tr_local;
  
  pcVar1 = "";
  if (tr->rtype == CK_ERROR) {
    pcVar1 = "(after this point) ";
  }
  pcVar1 = ck_strdup_printf("%s:%d: %s%s",tr->file,(ulong)(uint)tr->line,pcVar1,tr->msg);
  return pcVar1;
}

Assistant:

char *tr_short_str(TestResult * tr)
{
    const char *exact_msg;
    char *rstr;

    exact_msg = (tr->rtype == CK_ERROR) ? "(after this point) " : "";

    rstr = ck_strdup_printf("%s:%d: %s%s",
                            tr->file, tr->line, exact_msg, tr->msg);

    return rstr;
}